

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

_Bool sesschan_seat_eof(Seat *seat)

{
  sesschan *sess;
  Seat *seat_local;
  
  sshfwd_write_eof((SshChannel *)seat[-6].vt);
  *(undefined1 *)((long)&seat[0xa6].vt + 1) = 1;
  queue_toplevel_callback(sesschan_check_close_callback,seat + -6);
  return true;
}

Assistant:

static bool sesschan_seat_eof(Seat *seat)
{
    sesschan *sess = container_of(seat, sesschan, seat);

    sshfwd_write_eof(sess->c);
    sess->seen_eof = true;

    queue_toplevel_callback(sesschan_check_close_callback, sess);
    return true;
}